

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.cpp
# Opt level: O0

Interaction * __thiscall phyr::Shape::sample(Shape *this,Interaction *ref,Point2f *u,double *pdf)

{
  uint uVar1;
  undefined8 in_RCX;
  long *in_RSI;
  Interaction *in_RDI;
  double *in_R8;
  double dVar2;
  Vector3<double> *this_00;
  Interaction *intr;
  Vector3f wi;
  Point3<double> *in_stack_ffffffffffffff78;
  Vector3<double> *v;
  Point3<double> *in_stack_ffffffffffffff80;
  Interaction *v_00;
  Vector3<double> local_38;
  double *local_20;
  
  v_00 = in_RDI;
  local_20 = in_R8;
  (**(code **)(*in_RSI + 0x38))(in_RDI,in_RSI,in_RCX,in_R8);
  Point3<double>::operator-(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  dVar2 = Vector3<double>::lengthSquared(&local_38);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    normalize<double>((Vector3<double> *)v_00);
    this_00 = (Vector3<double> *)distanceSquared<double>(&v_00->p,&in_RDI->p);
    v = (Vector3<double> *)&v_00->n;
    Vector3<double>::operator-(this_00);
    dVar2 = absDot<double>((Normal3<double> *)this_00,v);
    *local_20 = ((double)this_00 / dVar2) * *local_20;
    uVar1 = std::isinf(*local_20);
    if ((uVar1 & 1) != 0) {
      *local_20 = 0.0;
    }
  }
  else {
    *local_20 = 0.0;
  }
  return in_RDI;
}

Assistant:

Interaction Shape::sample(const Interaction& ref, const Point2f& u,
                          Real* pdf) const {
    Interaction intr = sample(u, pdf);
    Vector3f wi = intr.p - ref.p;
    if (wi.lengthSquared() == 0)
        *pdf = 0;
    else {
        wi = normalize(wi);
        // Convert from area measure, as returned by the Sample() call
        // above, to solid angle measure.
        *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        if (std::isinf(*pdf)) *pdf = 0.f;
    }
    return intr;
}